

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O1

float recall_tree_ns::train_node(recall_tree *b,single_learner *base,example *ec,uint32_t cn)

{
  uint64_t *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint32_t uVar6;
  node *pnVar7;
  double dVar8;
  double dVar9;
  uint64_t uVar10;
  double dVar11;
  
  fVar4 = (ec->l).simple.label;
  fVar2 = (ec->l).simple.weight;
  fVar5 = (ec->pred).scalar;
  dVar8 = updated_entropy(b,(b->nodes)._begin[cn].left,ec);
  dVar9 = updated_entropy(b,(b->nodes)._begin[cn].right,ec);
  pnVar7 = (b->nodes)._begin;
  dVar11 = (double)fVar2;
  dVar8 = pnVar7[pnVar7[cn].left].n * (dVar8 - pnVar7[pnVar7[cn].left].entropy) + dVar11 * dVar8;
  dVar9 = pnVar7[pnVar7[cn].right].n * (dVar9 - pnVar7[pnVar7[cn].right].entropy) + dVar11 * dVar9;
  (ec->l).simple.label = *(float *)(&DAT_0027ac18 + (ulong)(dVar8 < dVar9) * 4);
  (ec->l).simple.weight = ABS((float)(dVar8 - dVar9));
  (ec->l).simple.initial = 0.0;
  uVar6 = (b->nodes)._begin[cn].base_router;
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar6);
  (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  uVar10 = (ec->super_example_predict).ft_offset - (ulong)(uVar6 * *(int *)(base + 0xe0));
  (ec->super_example_predict).ft_offset = uVar10;
  uVar6 = (b->nodes)._begin[cn].base_router;
  (ec->super_example_predict).ft_offset = *(int *)(base + 0xe0) * uVar6 + uVar10;
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 - (ulong)(uVar6 * *(int *)(base + 0xe0));
  fVar3 = (ec->pred).scalar;
  (ec->l).simple.label = fVar4;
  (ec->l).simple.weight = fVar2;
  (ec->pred).scalar = fVar5;
  return fVar3;
}

Assistant:

float train_node(recall_tree& b, single_learner& base, example& ec, uint32_t cn)
{
  MULTICLASS::label_t mc = ec.l.multi;
  uint32_t save_pred = ec.pred.multiclass;

  // minimize entropy
  // better than maximize expected likelihood, and the proofs go through :)
  double new_left = updated_entropy(b, b.nodes[cn].left, ec);
  double new_right = updated_entropy(b, b.nodes[cn].right, ec);
  double old_left = b.nodes[b.nodes[cn].left].entropy;
  double old_right = b.nodes[b.nodes[cn].right].entropy;
  double nl = b.nodes[b.nodes[cn].left].n;
  double nr = b.nodes[b.nodes[cn].right].n;
  double delta_left = nl * (new_left - old_left) + mc.weight * new_left;
  double delta_right = nr * (new_right - old_right) + mc.weight * new_right;
  float route_label = delta_left < delta_right ? -1.f : 1.f;
  float imp_weight = fabs((float)(delta_left - delta_right));

  ec.l.simple = {route_label, imp_weight, 0.};
  base.learn(ec, b.nodes[cn].base_router);

  // TODO: using the updated routing seems to help
  // TODO: consider faster version using updated_prediction
  // TODO: (doesn't play well with link function)
  base.predict(ec, b.nodes[cn].base_router);

  float save_scalar = ec.pred.scalar;

  ec.l.multi = mc;
  ec.pred.multiclass = save_pred;

  return save_scalar;
}